

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::ShaderProgram::~ShaderProgram(ShaderProgram *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ShaderProgram_001521d8;
  InfoLog::~InfoLog(&this->linkInfoLog);
  List::~List(&this->shaders);
  return;
}

Assistant:

~ShaderProgram		(void) {}